

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  string *psVar3;
  iterator iVar4;
  _Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *this_00;
  pointer pCVar5;
  ConfigurePreset *pCVar6;
  TestPreset *pTVar7;
  PackagePreset *pPVar8;
  BuildPreset *pBVar9;
  ostream *poVar10;
  _Tp_alloc_type *__alloc;
  size_t __n;
  int iVar11;
  char *this_01;
  WorkflowStep *step;
  pointer pCVar13;
  long lVar14;
  static_string_view type;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view type_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  static_string_view type_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  static_string_view type_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  allocator_type local_342;
  allocator<char> local_341;
  int stepNumber;
  allocator_type local_339;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  static_string_view local_320;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f0;
  WorkflowFresh local_2d4;
  undefined1 local_2d0 [64];
  string local_290 [32];
  string local_270 [32];
  _Alloc_hider local_250;
  WorkflowStep *local_248;
  cmCMakePresetsGraph settingsFile;
  cmake *pcVar12;
  
  local_2d4 = fresh;
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,&settingsFile.errors);
  std::__cxx11::string::~string((string *)&settingsFile);
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,&settingsFile.errors);
  std::__cxx11::string::~string((string *)&settingsFile);
  settingsFile.errors._M_dataplus._M_p = (pointer)&settingsFile.errors.field_2;
  settingsFile.errors._M_string_length = 0;
  settingsFile.errors.field_2._M_local_buf[0] = '\0';
  settingsFile.parseState.doc._M_dataplus._M_p = (pointer)&settingsFile.parseState.doc.field_2;
  settingsFile.parseState.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.parseState.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.parseState.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.parseState.errors.
  super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.parseState.errors.
  super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.parseState.errors.
  super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.parseState.doc._M_string_length = 0;
  settingsFile.parseState.doc.field_2._M_local_buf[0] = '\0';
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  settingsFile.SourceDir._M_dataplus._M_p = (pointer)&settingsFile.SourceDir.field_2;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.WorkflowPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.PackagePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.TestPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.BuildPresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  settingsFile.ConfigurePresetOrder.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.SourceDir._M_string_length = 0;
  settingsFile.SourceDir.field_2._M_local_buf[0] = '\0';
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  settingsFile.Files.
  super__Vector_base<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>,_std::allocator<std::unique_ptr<cmCMakePresetsGraph::File,_std::default_delete<cmCMakePresetsGraph::File>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.ConfigurePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.BuildPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.TestPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       settingsFile.PackagePresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  settingsFile.WorkflowPresets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  bVar2 = cmCMakePresetsGraph::ReadProjectPresets(&settingsFile,psVar3,false);
  if (bVar2) {
    if (listPresets == Yes) {
      iVar11 = 0;
      cmCMakePresetsGraph::PrintWorkflowPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
    }
    else {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
              ::find(&settingsFile.WorkflowPresets._M_t,presetName);
      iVar11 = 1;
      if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x22;
        cmStrCat<char_const(&)[28],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                  ((string *)local_2d0,(char (*) [28])"No such workflow preset in ",psVar3,
                   (char (*) [4])0x6a28da,presetName,(char *)&args);
        cmSystemTools::Error((string *)local_2d0);
      }
      else {
        if ((char)iVar4._M_node[4]._M_color != _S_black) {
          if ((char)iVar4._M_node[0x11]._M_color == _S_red) {
            cmStrCat<char_const(&)[37],std::__cxx11::string_const&,char_const(&)[27]>
                      ((string *)local_2d0,(char (*) [37])"Could not evaluate workflow preset \"",
                       presetName,(char (*) [27])"\": Invalid macro expansion");
            cmSystemTools::Error((string *)local_2d0);
          }
          else {
            if (*(char *)&iVar4._M_node[0xe]._M_left != '\0') {
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              step = (WorkflowStep *)iVar4._M_node[0x10]._M_parent;
              local_248 = (WorkflowStep *)iVar4._M_node[0x10]._M_left;
              __alloc = (_Tp_alloc_type *)&DAT_00000028;
              this_00 = (_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *)
                        (((long)local_248 - (long)step) / 0x28);
              if ((_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *)0x1745d1745d1745d
                  < this_00) {
                std::__throw_length_error("vector::reserve");
              }
              if (local_248 != step) {
                pCVar5 = std::_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>::
                         _M_allocate(this_00,(size_t)local_248);
                std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::_S_relocate
                          ((pointer)0x0,(pointer)0x0,pCVar5,__alloc);
                std::_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>::_M_deallocate
                          ((_Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_> *)0x0,
                           (pointer)0x0,__n);
                steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pCVar5 + (long)this_00;
                step = (WorkflowStep *)iVar4._M_node[0x10]._M_parent;
                local_248 = (WorkflowStep *)iVar4._M_node[0x10]._M_left;
                steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
                super__Vector_impl_data._M_finish = pCVar5;
              }
              stepNumber = 1;
              local_250._M_p = local_2d0 + 0x20;
              iVar11 = 1;
              steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl.
              super__Vector_impl_data._M_start =
                   steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>._M_impl
                   .super__Vector_impl_data._M_finish;
              for (; pCVar5 = steps.
                              super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>.
                              _M_impl.super__Vector_impl_data._M_finish, step != local_248;
                  step = step + 1) {
                switch(step->PresetType) {
                case Configure:
                  type.super_string_view._M_str = "configure";
                  type.super_string_view._M_len = 9;
                  pCVar6 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                     (this,type,&settingsFile.ConfigurePresets,step);
                  if (pCVar6 == (ConfigurePreset *)0x0) goto LAB_001b9475;
                  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_2d0,(string *)psVar3);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(local_2d0 + 0x20),"--preset",(allocator<char> *)&local_2f0);
                  std::__cxx11::string::string(local_290,(string *)&step->PresetName);
                  this_01 = local_2d0;
                  __l._M_len = 3;
                  __l._M_array = (iterator)this_01;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&args,__l,(allocator_type *)&local_320);
                  lVar14 = 0x40;
                  do {
                    std::__cxx11::string::~string((string *)(local_2d0 + lVar14));
                    lVar14 = lVar14 + -0x20;
                  } while (lVar14 != -0x20);
                  if (local_2d4 == Yes) {
                    this_01 = "--fresh";
                    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                    emplace_back<char_const(&)[8]>
                              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                               &args,(char (*) [8])"--fresh");
                  }
                  local_2f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x9;
                  local_2f0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x671320;
                  BuildWorkflowStep((function<int_()> *)local_2d0,(cmake *)this_01,&args);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,(static_string_view *)&local_2f0,
                             &step->PresetName,(function<int_()> *)local_2d0);
                  std::_Function_base::~_Function_base((_Function_base *)local_2d0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&args);
                  break;
                case Build:
                  type_02.super_string_view._M_str = "build";
                  type_02.super_string_view._M_len = 5;
                  pBVar9 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                     (this,type_02,&settingsFile.BuildPresets,step);
                  if (pBVar9 == (BuildPreset *)0x0) goto LAB_001b9475;
                  local_320.super_string_view._M_len = 5;
                  local_320.super_string_view._M_str = "build";
                  psVar3 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_2d0,(string *)psVar3);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(local_2d0 + 0x20),"--build",&local_341);
                  std::__cxx11::string::string<std::allocator<char>>
                            (local_290,"--preset",(allocator<char> *)&local_342);
                  std::__cxx11::string::string(local_270,(string *)&step->PresetName);
                  pcVar12 = (cmake *)local_2d0;
                  __l_02._M_len = 4;
                  __l_02._M_array = (iterator)pcVar12;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_2f0,__l_02,&local_339);
                  BuildWorkflowStep((function<int_()> *)&args,pcVar12,&local_2f0);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_320,&step->PresetName,
                             (function<int_()> *)&args);
                  std::_Function_base::~_Function_base((_Function_base *)&args);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_2f0);
                  lVar14 = 0x60;
                  do {
                    std::__cxx11::string::~string((string *)(local_2d0 + lVar14));
                    lVar14 = lVar14 + -0x20;
                  } while (lVar14 != -0x20);
                  break;
                case Test:
                  type_00.super_string_view._M_str = "test";
                  type_00.super_string_view._M_len = 4;
                  pTVar7 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                     (this,type_00,&settingsFile.TestPresets,step);
                  if (pTVar7 == (TestPreset *)0x0) goto LAB_001b9475;
                  local_320.super_string_view._M_len = 4;
                  local_320.super_string_view._M_str = "test";
                  psVar3 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_2d0,(string *)psVar3);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(local_2d0 + 0x20),"--preset",&local_341);
                  std::__cxx11::string::string(local_290,(string *)&step->PresetName);
                  pcVar12 = (cmake *)local_2d0;
                  __l_00._M_len = 3;
                  __l_00._M_array = (iterator)pcVar12;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_2f0,__l_00,&local_342);
                  BuildWorkflowStep((function<int_()> *)&args,pcVar12,&local_2f0);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_320,&step->PresetName,
                             (function<int_()> *)&args);
                  std::_Function_base::~_Function_base((_Function_base *)&args);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_2f0);
                  lVar14 = 0x40;
                  do {
                    std::__cxx11::string::~string((string *)(local_2d0 + lVar14));
                    lVar14 = lVar14 + -0x20;
                  } while (lVar14 != -0x20);
                  break;
                case Package:
                  type_01.super_string_view._M_str = "package";
                  type_01.super_string_view._M_len = 7;
                  pPVar8 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                     (this,type_01,&settingsFile.PackagePresets,step);
                  if (pPVar8 == (PackagePreset *)0x0) goto LAB_001b9475;
                  local_320.super_string_view._M_len = 7;
                  local_320.super_string_view._M_str = "package";
                  psVar3 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                  std::__cxx11::string::string((string *)local_2d0,(string *)psVar3);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(local_2d0 + 0x20),"--preset",&local_341);
                  std::__cxx11::string::string(local_290,(string *)&step->PresetName);
                  pcVar12 = (cmake *)local_2d0;
                  __l_01._M_len = 3;
                  __l_01._M_array = (iterator)pcVar12;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_2f0,__l_01,&local_342);
                  BuildWorkflowStep((function<int_()> *)&args,pcVar12,&local_2f0);
                  std::
                  vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                  ::
                  emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                            ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                              *)&steps,&stepNumber,&local_320,&step->PresetName,
                             (function<int_()> *)&args);
                  std::_Function_base::~_Function_base((_Function_base *)&args);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_2f0);
                  lVar14 = 0x40;
                  do {
                    std::__cxx11::string::~string((string *)(local_2d0 + lVar14));
                    lVar14 = lVar14 + -0x20;
                  } while (lVar14 != -0x20);
                }
                stepNumber = stepNumber + 1;
              }
              bVar2 = true;
              pCVar13 = steps.super__Vector_base<CalculatedStep,_std::allocator<CalculatedStep>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              do {
                if (pCVar13 == pCVar5) {
                  iVar11 = 0;
                  break;
                }
                if (!bVar2) {
                  std::operator<<((ostream *)&std::cout,"\n");
                }
                poVar10 = std::operator<<((ostream *)&std::cout,"Executing workflow step ");
                poVar10 = (ostream *)std::ostream::operator<<(poVar10,pCVar13->StepNumber);
                poVar10 = std::operator<<(poVar10," of ");
                poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)poVar10);
                poVar10 = std::operator<<(poVar10,": ");
                poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                    (poVar10,(pCVar13->Type).super_string_view._M_str,
                                     (pCVar13->Type).super_string_view._M_len);
                poVar10 = std::operator<<(poVar10," preset \"");
                poVar10 = std::operator<<(poVar10,(string *)&pCVar13->Name);
                std::operator<<(poVar10,"\"\n\n");
                std::ostream::flush();
                iVar11 = std::function<int_()>::operator()(&pCVar13->Action);
                pCVar13 = pCVar13 + 1;
                bVar2 = false;
              } while (iVar11 == 0);
LAB_001b9475:
              std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector(&steps);
              goto LAB_001b947f;
            }
            psVar3 = GetHomeDirectory_abi_cxx11_(this);
            args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x22;
            cmStrCat<char_const(&)[40],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                      ((string *)local_2d0,(char (*) [40])"Cannot use disabled workflow preset in ",
                       psVar3,(char (*) [4])0x6a28da,presetName,(char *)&args);
            cmSystemTools::Error((string *)local_2d0);
          }
          std::__cxx11::string::~string((string *)local_2d0);
          cmCMakePresetsGraph::PrintWorkflowPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
          goto LAB_001b947f;
        }
        psVar3 = GetHomeDirectory_abi_cxx11_(this);
        args.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0x22;
        cmStrCat<char_const(&)[38],std::__cxx11::string_const&,char_const(&)[4],std::__cxx11::string_const&,char>
                  ((string *)local_2d0,(char (*) [38])"Cannot use hidden workflow preset in ",psVar3
                   ,(char (*) [4])0x6a28da,presetName,(char *)&args);
        cmSystemTools::Error((string *)local_2d0);
      }
      std::__cxx11::string::~string((string *)local_2d0);
      cmCMakePresetsGraph::PrintWorkflowPresetList(&settingsFile,(PrintPrecedingNewline *)0x0);
    }
  }
  else {
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    iVar11 = 1;
    cmJSONState::GetErrorMessage_abi_cxx11_((string *)&args,&settingsFile.parseState,true);
    cmStrCat<char_const(&)[29],std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string>
              ((string *)local_2d0,(char (*) [29])"Could not read presets from ",psVar3,
               (char (*) [2])0x6920f8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args);
    cmSystemTools::Error((string *)local_2d0);
    std::__cxx11::string::~string((string *)local_2d0);
    std::__cxx11::string::~string((string *)&args);
  }
LAB_001b947f:
  cmCMakePresetsGraph::~cmCMakePresetsGraph(&settingsFile);
  return iVar11;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != true) {
    cmSystemTools::Error(cmStrCat("Could not read presets from ",
                                  this->GetHomeDirectory(), ":",
                                  settingsFile.parseState.GetErrorMessage()));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}